

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  uint __fd;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  char *errmsg;
  long lVar9;
  ulong uVar10;
  char local_8038 [32776];
  
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar2 = getopt(argc,argv,"fF:hnsc");
            if (iVar2 != 0x46) break;
            formatted_output = atoi(_optarg);
          }
          if (iVar2 != 99) break;
          color = 1;
        }
        if (iVar2 != 0x66) break;
        formatted_output = 2;
      }
      if (iVar2 != 0x6e) break;
      show_output = '\x01';
    }
    if (iVar2 != 0x73) break;
    strict_mode = '\x01';
  }
  if (iVar2 == -1) {
    if (_optind < argc) {
      fname = argv[_optind];
      __fd = open(fname,0,0);
      showmem();
      lVar3 = json_tokener_new_ex(0x20);
      pFVar1 = _stderr;
      if (lVar3 == 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"unable to allocate json_tokener: %s\n",pcVar5);
LAB_001015f6:
        exit(1);
      }
      if (strict_mode == '\x01') {
        json_tokener_set_flags(lVar3,3);
      }
      lVar7 = 0;
      do {
        lVar9 = lVar7;
        uVar6 = read(__fd,local_8038,0x8000);
        pFVar1 = _stderr;
        if ((long)uVar6 < 1) {
          if ((long)uVar6 < 0) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar1,"error reading fd %d: %s\n",(ulong)__fd,pcVar5);
          }
          json_tokener_free();
          showmem();
          exit(0);
        }
        uVar10 = 0;
        while (lVar7 = lVar9 + uVar6, uVar6 != uVar10) {
          lVar7 = json_tokener_parse_ex(lVar3,local_8038 + uVar10,(int)uVar6 - (int)uVar10);
          iVar2 = json_tokener_get_error(lVar3);
          if (iVar2 != 1 && lVar7 == 0) {
            uVar10 = uVar10 + (long)*(int *)(lVar3 + 0x20);
            pcVar5 = "";
            if (uVar10 < 0x8000) {
              pcVar5 = local_8038 + uVar10;
            }
            fflush(_stdout);
            pFVar1 = _stderr;
            uVar8 = json_tokener_error_desc(iVar2);
            fprintf(pFVar1,"Failed at offset %lu: %s %c\n",uVar10 + lVar9,uVar8,
                    (ulong)(uint)(int)*pcVar5);
            json_tokener_free(lVar3);
            goto LAB_001015f6;
          }
          if (lVar7 != 0) {
            fprintf(_stderr,"Successfully parsed object from %s\n",fname);
            if (show_output == '\0') {
              pcVar5 = (char *)json_object_to_json_string_ext
                                         (lVar7,(uint)color << 5 | formatted_output);
              puts(pcVar5);
            }
            showmem();
            json_object_put(lVar7);
          }
          uVar10 = uVar10 + (long)*(int *)(lVar3 + 0x20);
          if (uVar6 < uVar10) {
            __assert_fail("start_pos <= retu",
                          "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/apps/json_parse.c"
                          ,0x7b,"int parseit(int, int (*)(struct json_object *))");
          }
        }
      } while( true );
    }
    pcVar5 = *argv;
    errmsg = "Expected argument after options";
  }
  else {
    if (iVar2 == 0x68) {
      usage(*argv,0,(char *)0x0);
    }
    pcVar5 = *argv;
    errmsg = "Unknown arguments";
  }
  usage(pcVar5,1,errmsg);
}

Assistant:

int main(int argc, char **argv)
{
	int opt;

	while ((opt = getopt(argc, argv, "fF:hnsc")) != -1)
	{
		switch (opt)
		{
		case 'f': formatted_output = JSON_C_TO_STRING_PRETTY; break;
		case 'F': formatted_output = atoi(optarg); break;
		case 'n': show_output = 0; break;
		case 's': strict_mode = 1; break;
		case 'c': color = JSON_C_TO_STRING_COLOR; break;
		case 'h': usage(argv[0], 0, NULL);
		default: /* '?' */ usage(argv[0], EXIT_FAILURE, "Unknown arguments");
		}
	}
	if (optind >= argc)
	{
		usage(argv[0], EXIT_FAILURE, "Expected argument after options");
	}
	fname = argv[optind];

	int fd = open(argv[optind], O_RDONLY, 0);
	showmem();
	if (parseit(fd, showobj) != 0)
		exit(EXIT_FAILURE);
	showmem();

	exit(EXIT_SUCCESS);
}